

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall ft::list<int,ft::allocator<int>>::merge<ft::less<int>>(void *this,long *x)

{
  int *piVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  node *first;
  
  if (((long *)this != x) && (lVar6 = x[2], lVar6 != 0)) {
    piVar1 = *(int **)((long)this + 8);
    piVar5 = *(int **)(*this + 0x10);
    lVar2 = *x;
    do {
      piVar3 = *(int **)(lVar2 + 0x10);
      if ((piVar5 == piVar1) || (*piVar3 < *piVar5)) {
        if ((piVar5 != piVar3) && (piVar4 = *(int **)(piVar3 + 4), piVar5 != piVar4)) {
          lVar6 = *(long *)(piVar3 + 2);
          *(int **)(lVar6 + 0x10) = piVar4;
          *(long *)(piVar4 + 2) = lVar6;
          lVar6 = *(long *)(piVar5 + 2);
          *(int **)(lVar6 + 0x10) = piVar3;
          *(long *)(piVar3 + 2) = lVar6;
          *(int **)(piVar5 + 2) = piVar3;
          *(int **)(piVar3 + 4) = piVar5;
          *(long *)((long)this + 0x10) = *(long *)((long)this + 0x10) + 1;
          lVar6 = x[2] + -1;
          x[2] = lVar6;
        }
      }
      else {
        piVar5 = *(int **)(piVar5 + 4);
      }
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

void merge(list & x, Compare comp) {
		if (this != &x) {
			iterator	it = this->begin();
			while (!x.empty()) {
				if (it == this->end() || comp(*(x.begin()), *it)) this->splice(it, x, x.begin());
				else ++it;
			}
		}
	}